

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.hpp
# Opt level: O2

void __thiscall CorUnix::CPalObjectBase::CPalObjectBase(CPalObjectBase *this,CObjectType *pot)

{
  (this->super_IPalObject)._vptr_IPalObject = (_func_int **)&PTR_GetObjectType_001876c8;
  this->m_lRefCount = 1;
  this->m_pvImmutableData = (VOID *)0x0;
  this->m_pvLocalData = (VOID *)0x0;
  this->m_pot = pot;
  (this->m_oa).sObjectName.m_pwsz = (WCHAR *)0x0;
  (this->m_oa).sObjectName.m_dwStringLength = 0;
  (this->m_oa).sObjectName.m_dwMaxLength = 0;
  (this->m_oa).pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  (this->m_sdlLocalData).super_IDataLock._vptr_IDataLock = (_func_int **)&PTR_ReleaseLock_00187780;
  (this->m_sdlLocalData).m_fInitialized = false;
  this->m_pthrCleanup = (CPalThread *)0x0;
  return;
}

Assistant:

CPalObjectBase(
            CObjectType *pot
            )
            :
            m_lRefCount(1),
            m_pvImmutableData(NULL),
            m_pvLocalData(NULL),
            m_pot(pot),
            m_pthrCleanup(NULL)
        {
        }